

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O1

lzma_ret decode_buffer(lzma_coder *coder,uint8_t *in,size_t *in_pos,size_t in_size,uint8_t *out,
                      size_t *out_pos,size_t out_size)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  uint8_t *puVar5;
  bool bVar6;
  lzma_ret lVar7;
  size_t *psVar8;
  ulong uVar9;
  size_t *psVar10;
  ulong __n;
  size_t sVar11;
  ulong uVar12;
  
  psVar1 = &(coder->dict).pos;
  sVar11 = *out_pos;
  psVar8 = psVar1;
  do {
    sVar2 = (coder->dict).size;
    if ((coder->dict).pos == sVar2) {
      *psVar1 = 0;
    }
    sVar3 = (coder->dict).pos;
    pvVar4 = (coder->lz).coder;
    uVar12 = out_size - sVar11;
    uVar9 = sVar2 - sVar3;
    if (uVar12 < uVar9) {
      uVar9 = uVar12;
    }
    (coder->dict).limit = uVar9 + sVar3;
    lVar7 = (*(coder->lz).code)(pvVar4,&coder->dict,in,in_pos,in_size);
    uVar9 = (coder->dict).pos;
    __n = uVar9 - sVar3;
    if (uVar12 < __n) {
      __assert_fail("copy_size <= out_size - *out_pos",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_decoder.c"
                    ,0x60,
                    "lzma_ret decode_buffer(lzma_coder *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t)"
                   );
    }
    puVar5 = (coder->dict).buf;
    memcpy(out + sVar11,puVar5 + sVar3,__n);
    sVar11 = __n + sVar11;
    *out_pos = sVar11;
    if ((coder->dict).need_reset == true) {
      *psVar1 = 0;
      (coder->dict).full = 0;
      bVar6 = false;
      puVar5[(coder->dict).size - 1] = '\0';
      (coder->dict).need_reset = false;
      psVar10 = (size_t *)(ulong)lVar7;
      if ((lVar7 == LZMA_OK) && (sVar11 != out_size)) {
LAB_0046b011:
        bVar6 = true;
        psVar10 = (size_t *)((ulong)psVar8 & 0xffffffff);
      }
    }
    else {
      bVar6 = false;
      psVar10 = (size_t *)(ulong)lVar7;
      if ((lVar7 == LZMA_OK) && (sVar11 != out_size)) {
        if ((coder->dict).size <= uVar9) goto LAB_0046b011;
        bVar6 = false;
      }
    }
    psVar8 = psVar10;
    if (!bVar6) {
      return (lzma_ret)psVar10;
    }
  } while( true );
}

Assistant:

static lzma_ret
decode_buffer(lzma_coder *coder,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size)
{
	while (true) {
		// Wrap the dictionary if needed.
		if (coder->dict.pos == coder->dict.size)
			coder->dict.pos = 0;

		// Store the current dictionary position. It is needed to know
		// where to start copying to the out[] buffer.
		const size_t dict_start = coder->dict.pos;

		// Calculate how much we allow coder->lz.code() to decode.
		// It must not decode past the end of the dictionary
		// buffer, and we don't want it to decode more than is
		// actually needed to fill the out[] buffer.
		coder->dict.limit = coder->dict.pos
				+ my_min(out_size - *out_pos,
					coder->dict.size - coder->dict.pos);

		// Call the coder->lz.code() to do the actual decoding.
		const lzma_ret ret = coder->lz.code(
				coder->lz.coder, &coder->dict,
				in, in_pos, in_size);

		// Copy the decoded data from the dictionary to the out[]
		// buffer.
		const size_t copy_size = coder->dict.pos - dict_start;
		assert(copy_size <= out_size - *out_pos);
		memcpy(out + *out_pos, coder->dict.buf + dict_start,
				copy_size);
		*out_pos += copy_size;

		// Reset the dictionary if so requested by coder->lz.code().
		if (coder->dict.need_reset) {
			lz_decoder_reset(coder);

			// Since we reset dictionary, we don't check if
			// dictionary became full.
			if (ret != LZMA_OK || *out_pos == out_size)
				return ret;
		} else {
			// Return if everything got decoded or an error
			// occurred, or if there's no more data to decode.
			//
			// Note that detecting if there's something to decode
			// is done by looking if dictionary become full
			// instead of looking if *in_pos == in_size. This
			// is because it is possible that all the input was
			// consumed already but some data is pending to be
			// written to the dictionary.
			if (ret != LZMA_OK || *out_pos == out_size
					|| coder->dict.pos < coder->dict.size)
				return ret;
		}
	}
}